

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O3

int __thiscall
kj::ArrayBuilder<kj::HashMap<kj::String,_int>::Entry>::truncate
          (ArrayBuilder<kj::HashMap<kj::String,_int>::Entry> *this,char *__file,__off_t __length)

{
  undefined8 *puVar1;
  long lVar2;
  long lVar3;
  undefined8 uVar4;
  undefined8 *puVar5;
  
  lVar2 = *(long *)this;
  puVar1 = *(undefined8 **)(this + 8);
  while (puVar5 = puVar1, (undefined8 *)((long)__file * 0x20 + lVar2) < puVar5) {
    puVar1 = puVar5 + -4;
    *(undefined8 **)(this + 8) = puVar1;
    lVar3 = puVar5[-4];
    if (lVar3 != 0) {
      uVar4 = puVar5[-3];
      *puVar1 = 0;
      puVar5[-3] = 0;
      (*(code *)**(undefined8 **)puVar5[-2])((undefined8 *)puVar5[-2],lVar3,1,uVar4,uVar4,0);
      puVar1 = *(undefined8 **)(this + 8);
    }
  }
  return (int)puVar5;
}

Assistant:

void truncate(size_t size) {
    KJ_IREQUIRE(size <= this->size(), "can't use truncate() to expand");

    T* target = ptr + size;
    if (__has_trivial_destructor(T)) {
      pos = target;
    } else {
      while (pos > target) {
        kj::dtor(*--pos);
      }
    }
  }